

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

bool __thiscall
duckdb::BitpackingState<signed_char,signed_char>::
Flush<duckdb::BitpackingCompressionState<signed_char,true,signed_char>::BitpackingWriter>
          (BitpackingState<signed_char,signed_char> *this)

{
  BitpackingState<signed_char,signed_char> *result;
  bool bVar1;
  BitpackingState<signed_char,signed_char> BVar2;
  BitpackingState<signed_char,signed_char> BVar3;
  long lVar4;
  unsigned_long uVar5;
  byte bVar6;
  ulong uVar7;
  bool bVar8;
  byte bVar9;
  char *values;
  ulong uVar10;
  ulong uVar11;
  
  bVar8 = true;
  if (*(idx_t *)(this + 0x1810) == 0) {
    return true;
  }
  if (this[0x1830] == (BitpackingState<signed_char,signed_char>)0x0) {
    BVar3 = this[0x1828];
    BVar2 = this[0x1829];
    if (BVar2 != BVar3) goto LAB_0171cf58;
  }
  BVar2 = this[0x1829];
  if ((byte)((char)this[0x1833] - 1U) < 2) {
    BitpackingCompressionState<signed_char,_true,_signed_char>::BitpackingWriter::WriteConstant
              ((char)BVar2,*(idx_t *)(this + 0x1810),*(void **)(this + 0x1820),(bool)this[0x1830]);
    *(long *)(this + 0x1818) = *(long *)(this + 0x1818) + 5;
    return true;
  }
  BVar3 = this[0x1828];
LAB_0171cf58:
  result = this + 0x182a;
  BVar3 = (BitpackingState<signed_char,signed_char>)
          TrySubtractOperator::Operation<signed_char,signed_char,signed_char>
                    ((int8_t)BVar2,(int8_t)BVar3,(int8_t *)result);
  this[0x1832] = BVar3;
  BitpackingState<signed_char,_signed_char>::CalculateDeltaStats
            ((BitpackingState<signed_char,_signed_char> *)this);
  if (this[0x1831] == (BitpackingState<signed_char,signed_char>)0x1) {
    BVar3 = this[0x182b];
    if ((this[0x182c] == BVar3) && (((byte)this[0x1833] & 0xfe) != 4)) {
      BitpackingCompressionState<signed_char,_true,_signed_char>::BitpackingWriter::
      WriteConstantDelta((char)this[0x182c],**(char **)(this + 0x808),*(idx_t *)(this + 0x1810),
                         *(char **)(this + 0x808),(bool *)(this + 0x1010),*(void **)(this + 0x1820))
      ;
      *(long *)(this + 0x1818) = *(long *)(this + 0x1818) + 6;
      return true;
    }
    if (this[0x182d] == (BitpackingState<signed_char,signed_char>)0x0) {
      uVar10 = 0;
    }
    else {
      bVar6 = 0;
      BVar2 = this[0x182d];
      do {
        bVar6 = bVar6 + 1;
        bVar1 = 1 < (byte)BVar2;
        BVar2 = (BitpackingState<signed_char,signed_char>)((char)BVar2 >> 1);
      } while (bVar1);
      uVar10 = 8;
      if (bVar6 < 8) {
        uVar10 = (ulong)bVar6;
      }
    }
    BVar2 = *result;
    if (BVar2 == (BitpackingState<signed_char,signed_char>)0x0) {
      bVar6 = 0;
    }
    else {
      bVar6 = 8;
      if (BVar2 != (BitpackingState<signed_char,signed_char>)0x80) {
        bVar9 = 1;
        bVar6 = ((byte)BVar2 ^ (char)BVar2 >> 7) - ((char)BVar2 >> 7);
        do {
          bVar9 = bVar9 + 1;
          bVar1 = 1 < bVar6;
          bVar6 = bVar6 >> 1;
        } while (bVar1);
        bVar6 = 8;
        if (bVar9 < 8) {
          bVar6 = bVar9;
        }
      }
    }
    if (((byte)uVar10 < bVar6) && (this[0x1833] != (BitpackingState<signed_char,signed_char>)0x5)) {
      if (*(long *)(this + 0x1810) == 0) {
        uVar11 = 0;
      }
      else {
        uVar7 = 0;
        do {
          this[uVar7 + 0x810] =
               (BitpackingState<signed_char,signed_char>)((char)this[uVar7 + 0x810] - (char)BVar3);
          uVar7 = uVar7 + 1;
          uVar11 = *(ulong *)(this + 0x1810);
        } while (uVar7 < uVar11);
        BVar3 = this[0x182b];
      }
      BitpackingCompressionState<signed_char,_true,_signed_char>::BitpackingWriter::WriteDeltaFor
                ((char *)(this + 0x810),(bool *)(this + 0x1010),(byte)uVar10,(char)BVar3,
                 (char)this[0x182e],*(char **)(this + 0x808),uVar11,*(void **)(this + 0x1820));
      uVar11 = *(ulong *)(this + 0x1810);
      lVar4 = *(long *)(this + 0x1818) + 10;
      *(long *)(this + 0x1818) = lVar4;
      if ((uVar11 & 0x1f) != 0) {
        uVar5 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar11 & 0x1f);
        uVar11 = (uVar11 - uVar5) + 0x20;
        lVar4 = *(long *)(this + 0x1818);
      }
      *(ulong *)(this + 0x1818) = (uVar10 * uVar11 >> 3) + lVar4;
      return true;
    }
  }
  if (this[0x1832] == (BitpackingState<signed_char,signed_char>)0x1) {
    if (*result == (BitpackingState<signed_char,signed_char>)0x0) {
      bVar6 = 0;
    }
    else {
      bVar9 = 0;
      BVar3 = *result;
      do {
        bVar9 = bVar9 + 1;
        bVar1 = 1 < (byte)BVar3;
        BVar3 = (BitpackingState<signed_char,signed_char>)((char)BVar3 >> 1);
      } while (bVar1);
      bVar6 = 8;
      if (bVar9 < 8) {
        bVar6 = bVar9;
      }
    }
    values = *(char **)(this + 0x808);
    BVar3 = this[0x1828];
    if (*(long *)(this + 0x1810) == 0) {
      uVar10 = 0;
    }
    else {
      uVar11 = 0;
      do {
        values[uVar11] = values[uVar11] - (char)BVar3;
        uVar11 = uVar11 + 1;
        uVar10 = *(ulong *)(this + 0x1810);
      } while (uVar11 < uVar10);
      values = *(char **)(this + 0x808);
      BVar3 = this[0x1828];
    }
    BitpackingCompressionState<signed_char,_true,_signed_char>::BitpackingWriter::WriteFor
              (values,(bool *)(this + 0x1010),bVar6,(char)BVar3,uVar10,*(void **)(this + 0x1820));
    uVar10 = *(ulong *)(this + 0x1810);
    if ((uVar10 & 0x1f) != 0) {
      uVar5 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar10 & 0x1f);
      uVar10 = (uVar10 - uVar5) + 0x20;
    }
    *(ulong *)(this + 0x1818) = *(long *)(this + 0x1818) + (bVar6 * uVar10 >> 3) + 9;
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}